

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jsonstats.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  char *__s;
  ostream *poVar1;
  allocator<char> local_99;
  string_view local_98;
  stat_t s;
  
  if (1 < argc) {
    __s = argv[1];
    if (argc != 2) {
      poVar1 = std::operator<<((ostream *)&std::cerr,"warning: ignoring everything after ");
      poVar1 = std::operator<<(poVar1,argv[2]);
      std::endl<char,std::char_traits<char>>(poVar1);
    }
    local_98._M_len = 0;
    local_98._M_str = (char *)0x0;
    std::__cxx11::string::string<std::allocator<char>>((string *)&s,__s,&local_99);
    local_98 = (string_view)get_corpus((string *)&s);
    std::__cxx11::string::~string((string *)&s);
    simdjson_computestats(&s,&local_98);
    if (s.valid == false) {
      poVar1 = std::operator<<((ostream *)&std::cerr,"not a valid JSON");
      std::endl<char,std::char_traits<char>>(poVar1);
    }
    else {
      puts(
          "# integer_count float_count string_count backslash_count nonasciibyte_count object_count array_count null_count true_count false_count byte_count structural_indexes_count"
          );
      printf("%zu %zu %zu %zu %zu %zu %zu %zu %zu %zu %zu %zu\n",s.integer_count,s.float_count,
             s.string_count,s.backslash_count,s.nonasciibyte_count,s.object_count,s.array_count,
             s.null_count,s.true_count,s.false_count,s.byte_count,s.structural_indexes_count);
    }
    return (uint)(s.valid == false);
  }
  poVar1 = std::operator<<((ostream *)&std::cerr,"Reads json, prints stats. ");
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<((ostream *)&std::cerr,"Usage: ");
  poVar1 = std::operator<<(poVar1,*argv);
  poVar1 = std::operator<<(poVar1," <jsonfile>");
  std::endl<char,std::char_traits<char>>(poVar1);
  exit(1);
}

Assistant:

int main(int argc, char *argv[]) {
  int optind = 1;
  if (optind >= argc) {
    cerr << "Reads json, prints stats. " << endl;
    cerr << "Usage: " << argv[0] << " <jsonfile>" << endl;

    exit(1);
  }
  const char *filename = argv[optind];
  if (optind + 1 < argc) {
    std::cerr << "warning: ignoring everything after " << argv[optind + 1] << std::endl;
  }
  std::string_view p;
  try {
    p = get_corpus(filename);
  } catch (const std::exception &e) { // caught by reference to base
    std::cerr << "Could not load the file " << filename << std::endl;
    return EXIT_FAILURE;
  }
  stat_t s =  simdjson_computestats(p);
  if(!s.valid) {
    std::cerr << "not a valid JSON" << std::endl;
    return EXIT_FAILURE;
  }


  printf("# integer_count float_count string_count backslash_count nonasciibyte_count object_count array_count null_count true_count false_count byte_count structural_indexes_count\n");
  printf("%zu %zu %zu %zu %zu %zu %zu %zu %zu %zu %zu %zu\n", s.integer_count, s.float_count,
  s.string_count, s.backslash_count, s.nonasciibyte_count, s.object_count, s.array_count,
  s.null_count, s.true_count, s.false_count, s.byte_count, s.structural_indexes_count);
  return EXIT_SUCCESS;
}